

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O2

strong_type<std::optional<double>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>_>
 __thiscall
ezy::features::result_interface<ezy::features::optional_adapter>::
impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
::map<____C_A_T_C_H____T_E_S_T____74()::__1&>
          (impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
           *this,anon_class_1_0_00000001 *fn)

{
  int *piVar1;
  ulong in_XMM0_Qa;
  strong_type<std::optional<double>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>_>
  sVar2;
  strong_type<std::optional<double>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>_>
  sVar3;
  
  if (this[4] ==
      (impl<ezy::strong_type<std::optional<int>,void,ezy::features::result_interface<ezy::features::optional_adapter>>>
       )0x1) {
    piVar1 = optional_adapter<std::optional<int>>::get_success<std::optional<int>>
                       ((optional<int> *)this);
    sVar2.super_strong_type_base<std::optional<double>,_true>.
    super_strong_type_payload<std::optional<double>,_true>._value.
    super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload._M_value = (double)*piVar1 * 1.5;
    sVar2.super_strong_type_base<std::optional<double>,_true>.
    super_strong_type_payload<std::optional<double>,_true>._value.
    super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>._9_7_ =
         (undefined7)((ulong)piVar1 >> 8);
    sVar2.super_strong_type_base<std::optional<double>,_true>.
    super_strong_type_payload<std::optional<double>,_true>._value.
    super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_engaged = true;
    return (strong_type<std::optional<double>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>_>
            )sVar2.super_strong_type_base<std::optional<double>,_true>.
             super_strong_type_payload<std::optional<double>,_true>._value.
             super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>;
  }
  sVar3.super_strong_type_base<std::optional<double>,_true>.
  super_strong_type_payload<std::optional<double>,_true>._value.
  super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>._8_8_ = 0
  ;
  sVar3.super_strong_type_base<std::optional<double>,_true>.
  super_strong_type_payload<std::optional<double>,_true>._value.
  super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)in_XMM0_Qa;
  return (strong_type<std::optional<double>,_void,_ezy::features::result_interface<ezy::features::optional_adapter>_>
          )sVar3.super_strong_type_base<std::optional<double>,_true>.
           super_strong_type_payload<std::optional<double>,_true>._value.
           super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>;
}

Assistant:

static constexpr Result map(ST&& t, Fn&& fn)
    {
      if (SourceTrait::is_success(t.get()))
        return Result(ResultTrait::make_underlying_success(
              ezy::invoke(std::forward<Fn>(fn), SourceTrait::get_success(std::forward<ST>(t).get()))
            ));
      else
        return Result(ResultTrait::make_underlying_error(SourceTrait::get_error(std::forward<ST>(t).get())));
    }